

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O2

void __thiscall Automaton::buildReads(Automaton *this)

{
  ReadNode RVar1;
  Repository *pRVar2;
  
  buildDirectReads(this);
  buildReadsDigraph(this);
  this->_M_reads_dfn = 0;
  RVar1._M_node = (_Base_ptr)Node<Read>::begin_nodes();
  while( true ) {
    pRVar2 = Node<Read>::repository();
    if ((_Rb_tree_header *)RVar1._M_node == &(pRVar2->_M_t)._M_impl.super__Rb_tree_header) break;
    if ((char)RVar1._M_node[1]._M_color == _S_black) {
      visitReadNode(this,RVar1);
    }
    RVar1._M_node = (_Base_ptr)std::_Rb_tree_increment(RVar1._M_node);
  }
  RVar1._M_node = (_Base_ptr)Node<Read>::begin_nodes();
  while( true ) {
    pRVar2 = Node<Read>::repository();
    if ((_Rb_tree_header *)RVar1._M_node == &(pRVar2->_M_t)._M_impl.super__Rb_tree_header) break;
    visitReadNode(this,RVar1);
    RVar1._M_node = (_Base_ptr)std::_Rb_tree_increment(RVar1._M_node);
  }
  return;
}

Assistant:

void Automaton::buildReads ()
{
  buildDirectReads ();
  buildReadsDigraph ();

  _M_reads_dfn = 0;

  for (ReadsGraph::iterator node = ReadsGraph::begin_nodes (); node != ReadsGraph::end_nodes (); ++node)
    {
      if (! node->root)
        continue;

      visitReadNode (node);
    }

  for (ReadsGraph::iterator node = ReadsGraph::begin_nodes (); node != ReadsGraph::end_nodes (); ++node)
    visitReadNode (node);
}